

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O1

void __thiscall
VertexAttrib64Bit::LimitTest::getVertexArrayConfiguration
          (LimitTest *this,_iteration iteration,attributeConfiguration *out_configuration)

{
  int iVar1;
  GLint GVar2;
  GLchar **ppGVar3;
  ulong uVar4;
  GLenum err;
  int iVar5;
  long lVar6;
  GLint max_vertex_attribs;
  int local_1c;
  
  uVar4 = (ulong)iteration;
  (*(this->super_Base).gl.getIntegerv)(0x8869,&local_1c);
  err = (*(this->super_Base).gl.getError)();
  glu::checkError(err,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xb9);
  if (iteration < (DMAT4X3_DMAT4|DVEC3_DVEC4)) {
    iVar5 = *(int *)(&DAT_01adfdbc + uVar4 * 4);
    iVar1 = *(int *)(&DAT_01adfdd8 + uVar4 * 4);
    GVar2 = *(GLint *)(&DAT_01adfdf4 + uVar4 * 4);
    ppGVar3 = (GLchar **)(&PTR_type_names_0212e1e8)[uVar4];
    out_configuration->m_n_attributes_per_group = local_1c / *(int *)(&DAT_01adfda0 + uVar4 * 4);
    out_configuration->m_n_elements = (GLint *)(&DAT_01adfdbc + iVar5);
    out_configuration->m_n_rows = (GLint *)(&DAT_01adfdd8 + iVar1);
    out_configuration->m_n_types = GVar2;
    out_configuration->m_type_names = ppGVar3;
  }
  if ((long)out_configuration->m_n_types < 1) {
    iVar5 = 0;
  }
  else {
    lVar6 = 0;
    iVar5 = 0;
    do {
      iVar5 = iVar5 + out_configuration->m_n_elements[lVar6] *
                      out_configuration->m_n_attributes_per_group;
      lVar6 = lVar6 + 1;
    } while (out_configuration->m_n_types != lVar6);
  }
  out_configuration->m_vertex_length = iVar5;
  return;
}

Assistant:

void LimitTest::getVertexArrayConfiguration(_iteration iteration, attributeConfiguration& out_configuration) const
{
	static const GLuint n_elements_per_scalar = 1;
	static const GLuint n_elements_per_vec2   = 2;
	static const GLuint n_elements_per_vec3   = 3;
	static const GLuint n_elements_per_vec4   = 4;
	static const GLuint n_elements_per_mat2   = 4;
	static const GLuint n_elements_per_mat2x3 = 6;
	static const GLuint n_elements_per_mat2x4 = 8;
	static const GLuint n_elements_per_mat3   = 9;
	static const GLuint n_elements_per_mat3x2 = 6;
	static const GLuint n_elements_per_mat3x4 = 12;
	static const GLuint n_elements_per_mat4   = 16;
	static const GLuint n_elements_per_mat4x2 = 8;
	static const GLuint n_elements_per_mat4x3 = 12;

	const GLint max_vertex_attribs = GetMaxVertexAttribs();

	switch (iteration)
	{
	case DOUBLE_DVEC2:
	{
		static const GLint n_elements[] = { n_elements_per_scalar, n_elements_per_vec2 };
		static const GLint n_types		= sizeof(n_elements) / sizeof(n_elements[0]);

		static const GLint divisor = 2;

		static const GLchar* type_names[] = { "double", "dvec2" };

		static const GLint n_rows[] = {
			1, 2,
		};

		out_configuration.m_n_attributes_per_group = max_vertex_attribs / divisor;
		out_configuration.m_n_elements			   = n_elements;
		out_configuration.m_n_rows				   = n_rows;
		out_configuration.m_n_types				   = n_types;
		out_configuration.m_type_names			   = type_names;
	}
	break;
	case DVEC3_DVEC4:
	{
		static const GLint n_elements[] = { n_elements_per_vec3, n_elements_per_vec4 };
		static const GLint n_types		= sizeof(n_elements) / sizeof(n_elements[0]);

		static const GLint divisor = 4;

		static const GLchar* type_names[] = { "dvec3", "dvec4" };

		static const GLint n_rows[] = {
			3, 4,
		};

		out_configuration.m_n_attributes_per_group = max_vertex_attribs / divisor;
		out_configuration.m_n_elements			   = n_elements;
		out_configuration.m_n_rows				   = n_rows;
		out_configuration.m_n_types				   = n_types;
		out_configuration.m_type_names			   = type_names;
	}
	break;
	case DMAT2:
	{
		static const GLint n_elements[] = { n_elements_per_mat2 };
		static const GLint n_types		= sizeof(n_elements) / sizeof(n_elements[0]);

		static const GLint divisor = 2;

		static const GLchar* type_names[] = { "dmat2" };

		static const GLint n_rows[] = { 2 };

		out_configuration.m_n_attributes_per_group = max_vertex_attribs / divisor;
		out_configuration.m_n_elements			   = n_elements;
		out_configuration.m_n_rows				   = n_rows;
		out_configuration.m_n_types				   = n_types;
		out_configuration.m_type_names			   = type_names;
	}
	break;
	case DMAT3X2_DMAT4X2:
	{
		static const GLint n_elements[] = { n_elements_per_mat3x2, n_elements_per_mat4x2 };
		static const GLint n_types		= sizeof(n_elements) / sizeof(n_elements[0]);

		static const GLint divisor = 8;

		static const GLchar* type_names[] = { "dmat3x2", "dmat4x2" };

		static const GLint n_rows[] = { 2, 2 };

		out_configuration.m_n_attributes_per_group = max_vertex_attribs / divisor;
		out_configuration.m_n_elements			   = n_elements;
		out_configuration.m_n_rows				   = n_rows;
		out_configuration.m_n_types				   = n_types;
		out_configuration.m_type_names			   = type_names;
	}
	break;
	case DMAT2X3_DMAT2X4:
	{
		static const GLint n_elements[] = { n_elements_per_mat2x3, n_elements_per_mat2x4 };
		static const GLint n_types		= sizeof(n_elements) / sizeof(n_elements[0]);

		static const GLint divisor = 8;

		static const GLchar* type_names[] = { "dmat2x3", "dmat2x4" };

		static const GLint n_rows[] = { 3, 4 };

		out_configuration.m_n_attributes_per_group = max_vertex_attribs / divisor;
		out_configuration.m_n_elements			   = n_elements;
		out_configuration.m_n_rows				   = n_rows;
		out_configuration.m_n_types				   = n_types;
		out_configuration.m_type_names			   = type_names;
	}
	break;
	case DMAT3_DMAT3X4:
	{
		static const GLint n_elements[] = { n_elements_per_mat3, n_elements_per_mat3x4 };
		static const GLint n_types		= sizeof(n_elements) / sizeof(n_elements[0]);

		static const GLint divisor = 12;

		static const GLchar* type_names[] = { "dmat3", "dmat3x4" };

		static const GLint n_rows[] = { 3, 4 };

		out_configuration.m_n_attributes_per_group = max_vertex_attribs / divisor;
		out_configuration.m_n_elements			   = n_elements;
		out_configuration.m_n_rows				   = n_rows;
		out_configuration.m_n_types				   = n_types;
		out_configuration.m_type_names			   = type_names;
	}
	break;
	case DMAT4X3_DMAT4:
	{
		static const GLint n_elements[] = { n_elements_per_mat4x3, n_elements_per_mat4 };
		static const GLint n_types		= sizeof(n_elements) / sizeof(n_elements[0]);

		static const GLint divisor = 16;

		static const GLchar* type_names[] = { "dmat4x3", "dmat4" };

		static const GLint n_rows[] = { 3, 4 };

		out_configuration.m_n_attributes_per_group = max_vertex_attribs / divisor;
		out_configuration.m_n_elements			   = n_elements;
		out_configuration.m_n_rows				   = n_rows;
		out_configuration.m_n_types				   = n_types;
		out_configuration.m_type_names			   = type_names;
	}
	break;
	}

	calculateVertexLength(out_configuration);
}